

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sizeclasstable.h
# Opt level: O2

size_t snmalloc::index_in_object(sizeclass_t sc,address_t addr)

{
  long lVar1;
  
  lVar1 = sc.value * 0x20;
  return (addr & *(ulong *)(sizeclass_metadata + lVar1 + 8)) -
         (*(long *)(sizeclass_metadata + lVar1 + 0x10) *
          (addr & *(ulong *)(sizeclass_metadata + lVar1 + 8)) >> 0x36) *
         *(long *)(sizeclass_metadata + lVar1);
}

Assistant:

constexpr size_t index_in_object(sizeclass_t sc, address_t addr)
  {
    return addr - start_of_object(sc, addr);
  }